

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  uint uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  size_type *psVar11;
  uint __val;
  _Alloc_hider _Var12;
  pointer this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint __len;
  string __str;
  string errorMessage;
  Board board;
  ofstream outputFile;
  ifstream inputFile;
  char *local_840 [2];
  char local_830 [16];
  long *local_820;
  long local_818;
  long local_810;
  long lStack_808;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  Solver local_740;
  Board local_608;
  Board local_520;
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  ifstream local_238 [520];
  
  if (argc == 4) {
    __s1 = argv[1];
    iVar3 = strcmp(__s1,"bfs");
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = strcmp(__s1,"dfs");
      if (iVar3 == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = strcmp(__s1,"dijkstra");
        if (iVar3 != 0) {
          paVar13 = &local_780.field_2;
          local_780._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"");
          errorOutput(&local_780);
          iVar3 = -1;
          _Var12._M_p = local_780._M_dataplus._M_p;
          goto LAB_0010565b;
        }
        iVar3 = 2;
      }
    }
    std::ifstream::ifstream(local_238,argv[2],_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7a0,
                 "There was a problem with the input file, please verify that the input file is there."
                 ,"");
      errorOutput(&local_7a0);
      iVar3 = -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p);
      }
    }
    else {
      std::ofstream::ofstream(&local_438,argv[3],_S_out);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::ifstream::close();
        local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7c0,
                   "There was a problem with the output file, please verify that the output file is there."
                   ,"");
        errorOutput(&local_7c0);
        iVar3 = -1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
          operator_delete(local_7c0._M_dataplus._M_p);
        }
      }
      else {
        Board::Board(&local_608);
        Board::populateBoard(&local_608,local_238);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"===========================",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7e0,"Initial board state:\n","");
        Board::print(&local_608,&local_7e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
          operator_delete(local_7e0._M_dataplus._M_p);
        }
        lVar7 = std::chrono::_V2::system_clock::now();
        Board::Board(&local_520,&local_608);
        Solver::Solver(&local_740,&local_520);
        if (local_520.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_520.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520.referrer._M_dataplus._M_p != &local_520.referrer.field_2) {
          operator_delete(local_520.referrer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520.identifier._M_dataplus._M_p != &local_520.identifier.field_2) {
          operator_delete(local_520.identifier._M_dataplus._M_p);
        }
        Solver::solve(&local_740,iVar3);
        lVar8 = std::chrono::_V2::system_clock::now();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"===========================",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Puzzle is solved.",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Number of steps to solve: ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"===========================",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        if (local_740.steps.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_740.steps.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
            super__Vector_impl_data._M_start) {
          __val = 0;
          this = local_740.steps.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          do {
            __len = 1;
            if (9 < __val) {
              uVar9 = (ulong)__val;
              uVar1 = 4;
              do {
                __len = uVar1;
                uVar4 = (uint)uVar9;
                if (uVar4 < 100) {
                  __len = __len - 2;
                  goto LAB_00105acb;
                }
                if (uVar4 < 1000) {
                  __len = __len - 1;
                  goto LAB_00105acb;
                }
                if (uVar4 < 10000) goto LAB_00105acb;
                uVar9 = uVar9 / 10000;
                uVar1 = __len + 4;
              } while (99999 < uVar4);
              __len = __len + 1;
            }
LAB_00105acb:
            local_840[0] = local_830;
            std::__cxx11::string::_M_construct((ulong)local_840,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_840[0],__len,__val);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)local_840,0,(char *)0x0,0x10c110);
            plVar10 = plVar6 + 2;
            if ((long *)*plVar6 == plVar10) {
              local_810 = *plVar10;
              lStack_808 = plVar6[3];
              local_820 = &local_810;
            }
            else {
              local_810 = *plVar10;
              local_820 = (long *)*plVar6;
            }
            local_818 = plVar6[1];
            *plVar6 = (long)plVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_820);
            psVar11 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_800.field_2._M_allocated_capacity = *psVar11;
              local_800.field_2._8_8_ = plVar6[3];
              local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
            }
            else {
              local_800.field_2._M_allocated_capacity = *psVar11;
              local_800._M_dataplus._M_p = (pointer)*plVar6;
            }
            this = this + -1;
            local_800._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            Board::print(this,&local_800);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_800._M_dataplus._M_p != &local_800.field_2) {
              operator_delete(local_800._M_dataplus._M_p);
            }
            if (local_820 != &local_810) {
              operator_delete(local_820);
            }
            if (local_840[0] != local_830) {
              operator_delete(local_840[0]);
            }
            Board::exportToFile(this,(ofstream *)&local_438);
            std::ios::widen((char)*(undefined8 *)(local_438 + -0x18) + (char)&local_438);
            std::ostream::put((char)&local_438);
            plVar6 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            __val = __val + 1;
          } while (this != local_740.steps.super__Vector_base<Board,_std::allocator<Board>_>._M_impl
                           .super__Vector_impl_data._M_start);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"===========================",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The puzzle is solved.",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "The total time in seconds the algorithm took to solve the puzzle: ",0x42);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar5 = std::ostream::_M_insert<double>((double)(lVar8 - lVar7) / 1000000000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "The total number of boards seen to find the solution including the initial state: "
                   ,0x52);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "The block with letter \'A\' represents the block which is asked to be rescued.",
                   0x4c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "The output states are written to the output file you provided.",0x3e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"===========================",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::ifstream::close();
        std::ofstream::close();
        if (local_740.board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_740.board.blocks.super__Vector_base<Block,_std::allocator<Block>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740.board.referrer._M_dataplus._M_p != &local_740.board.referrer.field_2) {
          operator_delete(local_740.board.referrer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740.board.identifier._M_dataplus._M_p != &local_740.board.identifier.field_2) {
          operator_delete(local_740.board.identifier._M_dataplus._M_p);
        }
        std::vector<Board,_std::allocator<Board>_>::~vector(&local_740.steps);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
        ::~_Rb_tree(&local_740.pastSteps._M_t);
        if (local_608.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_608.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608.referrer._M_dataplus._M_p != &local_608.referrer.field_2) {
          operator_delete(local_608.referrer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608.identifier._M_dataplus._M_p != &local_608.identifier.field_2) {
          operator_delete(local_608.identifier._M_dataplus._M_p);
        }
        iVar3 = 0;
      }
      local_438 = _VTT;
      *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_430);
      std::ios_base::~ios_base(local_340);
    }
    std::ifstream::~ifstream(local_238);
  }
  else {
    paVar13 = &local_760.field_2;
    local_760._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"");
    errorOutput(&local_760);
    iVar3 = 0;
    _Var12._M_p = local_760._M_dataplus._M_p;
LAB_0010565b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p != paVar13) {
      operator_delete(_Var12._M_p);
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]) {

    // Do not execute if the number of parameters are wrong.
    if (argc != 4) {
        errorOutput();
        return 0;
    }

    // Open the files.
    int algorithm = 0;
    if (strcmp(argv[1], "bfs") == 0) {
        algorithm = BFS;
    } else if (strcmp(argv[1], "dfs") == 0) {
        algorithm = DFS;
    } else if (strcmp(argv[1], "dijkstra") == 0) {
        algorithm = DIJKSTRA;
    } else {
        errorOutput();
        return -1;
    }

    ifstream inputFile(argv[2]);
    if (!inputFile.is_open()) {
        errorOutput("There was a problem with the input file, please verify that the input file is there.");
        return -1;
    }

    ofstream outputFile(argv[3]);
    if (!outputFile.is_open()) {
        inputFile.close();
        errorOutput("There was a problem with the output file, please verify that the output file is there.");
        return -1;
    }

    try {
        // Create and populate the board from the input file.
        Board board;
        board.populateBoard(inputFile);

        // Print the initial state of the board.
        printSeperator();
        board.print("Initial board state:\n");


        // Record start time
        auto start = chrono::high_resolution_clock::now();

        // Solve the board with the algorithm provided.
        Solver solution(board);
        solution.solve(algorithm);

        // Record end time
        auto finish = chrono::high_resolution_clock::now();

        printSeperator();
        pp("Puzzle is solved.");
        pp2("Number of steps to solve: ", solution.steps.size());
        printSeperator();

        int i = 0;
        for (vector<Board>::reverse_iterator it = solution.steps.rbegin(); it != solution.steps.rend(); ++it) {

            // Print the board to the screen.
            it->print("Step " + to_string(i) + "\n");

            // Export the board state to the output file.
            it->exportToFile(outputFile);

            // Set the spacing between different board states in the file.
            outputFile << endl << endl;
            i++;
        }

        printSeperator();
        std::chrono::duration<double> runningTime = finish - start;
        pp("The puzzle is solved.");
        pp2("The total time in seconds the algorithm took to solve the puzzle: ", runningTime.count());
        pp2("The total number of boards seen to find the solution including the initial state: ",
            solution.numberOfNodes);
        pp("The block with letter 'A' represents the block which is asked to be rescued.");
        pp("The output states are written to the output file you provided.");
        printSeperator();

        inputFile.close();
        outputFile.close();
        return 0;
    } catch (string errorMessage) {
        cerr << errorMessage << endl;
        return -1;
    }
}